

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_nnquant.c
# Opt level: O0

void learn(nn_quant *nnq,int verbose)

{
  int iVar1;
  uchar *puVar2;
  int iVar3;
  int al_00;
  int b_00;
  int g_00;
  int r_00;
  int i_00;
  uint uVar4;
  ulong uVar5;
  uchar *lim;
  uchar *p;
  int local_40;
  int samplepixels;
  int delta;
  int step;
  int alpha;
  int rad;
  int radius;
  int r;
  int g;
  int b;
  int al;
  int j;
  int i;
  int verbose_local;
  nn_quant *nnq_local;
  
  nnq->alphadec = (nnq->samplefac + -1) / 3 + 0x1e;
  lim = nnq->thepicture;
  puVar2 = nnq->thepicture;
  iVar1 = nnq->lengthcount;
  iVar3 = nnq->lengthcount / (nnq->samplefac << 2);
  local_40 = iVar3 / 100;
  if (local_40 == 0) {
    local_40 = 1;
  }
  delta = 0x400;
  alpha = 0x800;
  step = 0x20;
  for (al = 0; al < 0x20; al = al + 1) {
    nnq->radpower[al] = (((0x400 - al * al) * 0x100) / 0x400) * 0x400;
  }
  if (verbose != 0) {
    gd_error_ex(5,"beginning 1D learning: initial radius=%d\n",0x20);
  }
  uVar5 = (long)nnq->lengthcount % 499;
  if ((int)uVar5 == 0) {
    uVar5 = (long)nnq->lengthcount % 0x1eb;
    if ((int)uVar5 == 0) {
      uVar5 = (long)nnq->lengthcount % 0x1e7;
      if ((int)uVar5 == 0) {
        samplepixels = 0x7dc;
      }
      else {
        samplepixels = 0x79c;
      }
    }
    else {
      samplepixels = 0x7ac;
    }
  }
  else {
    samplepixels = 0x7cc;
  }
  uVar5 = uVar5 & 0xffffffff;
  al = 0;
  while (al < iVar3) {
    al_00 = (uint)*lim << 4;
    b_00 = (uint)lim[2] << 4;
    g_00 = (uint)lim[3] << 4;
    r_00 = (uint)lim[1] << 4;
    i_00 = contest(nnq,al_00,b_00,g_00,r_00);
    altersingle(nnq,delta,i_00,al_00,b_00,g_00,r_00);
    if (step != 0) {
      alterneigh(nnq,step,i_00,al_00,b_00,g_00,r_00);
    }
    for (lim = lim + samplepixels; puVar2 + iVar1 <= lim; lim = lim + -(long)nnq->lengthcount) {
    }
    al = al + 1;
    uVar5 = (long)al % (long)local_40 & 0xffffffff;
    if ((int)((long)al % (long)local_40) == 0) {
      delta = delta - delta / nnq->alphadec;
      uVar5 = (long)alpha % 0x1e & 0xffffffff;
      alpha = alpha - alpha / 0x1e;
      step = alpha >> 6;
      if (step < 2) {
        step = 0;
      }
      for (b = 0; b < step; b = b + 1) {
        uVar4 = delta * (((step * step - b * b) * 0x100) / (step * step));
        uVar5 = (ulong)uVar4;
        nnq->radpower[b] = uVar4;
      }
    }
  }
  if (verbose != 0) {
    gd_error_ex(5,"finished 1D learning: final alpha=%f !\n",(double)((float)delta / 1024.0),uVar5);
  }
  return;
}

Assistant:

void learn(nnq, verbose) /* Stu: N.B. added parameter so that main() could control verbosity. */
nn_quant *nnq;
int verbose;
{
	register int i,j,al,b,g,r;
	int radius,rad,alpha,step,delta,samplepixels;
	register unsigned char *p;
	unsigned char *lim;

	nnq->alphadec = 30 + ((nnq->samplefac-1)/3);
	p = nnq->thepicture;
	lim = nnq->thepicture + nnq->lengthcount;
	samplepixels = nnq->lengthcount/(4 * nnq->samplefac);
	/* here's a problem with small images: samplepixels < ncycles => delta = 0 */
	delta = samplepixels/ncycles;
	/* kludge to fix */
	if(delta==0) delta = 1;
	alpha = initalpha;
	radius = initradius;

	rad = radius >> radiusbiasshift;

	for (i=0; i<rad; i++)
		nnq->radpower[i] = alpha*(((rad*rad - i*i)*radbias)/(rad*rad));

	if (verbose) gd_error_ex(GD_NOTICE, "beginning 1D learning: initial radius=%d\n", rad);

	if ((nnq->lengthcount%prime1) != 0) step = 4*prime1;
	else {
		if ((nnq->lengthcount%prime2) !=0) step = 4*prime2;
		else {
			if ((nnq->lengthcount%prime3) !=0) step = 4*prime3;
			else step = 4*prime4;
		}
	}

	i = 0;
	while (i < samplepixels) {
		al = p[ALPHA] << netbiasshift;
		b = p[BLUE] << netbiasshift;
		g = p[GREEN] << netbiasshift;
		r = p[RED] << netbiasshift;
		j = contest(nnq, al,b,g,r);

		altersingle(nnq, alpha,j,al,b,g,r);
		if (rad) alterneigh(nnq, rad,j,al,b,g,r);   /* alter neighbours */

		p += step;
		while (p >= lim) p -= nnq->lengthcount;

		i++;
		if (i%delta == 0) {                    /* FPE here if delta=0*/
			alpha -= alpha / nnq->alphadec;
			radius -= radius / radiusdec;
			rad = radius >> radiusbiasshift;
			if (rad <= 1) rad = 0;
			for (j=0; j<rad; j++)
				nnq->radpower[j] = alpha*(((rad*rad - j*j)*radbias)/(rad*rad));
		}
	}
	if (verbose) gd_error_ex(GD_NOTICE, "finished 1D learning: final alpha=%f !\n",((float)alpha)/initalpha);
}